

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void RVO::linearProgram3(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,size_t numObstLines,
                        size_t beginLine,float radius,Vector2 *result)

{
  Vector2 VVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference this;
  const_reference vector;
  size_t sVar4;
  size_type sVar5;
  float fVar6;
  float y;
  double dVar7;
  Vector2 local_100;
  Vector2 local_f8;
  Vector2 local_f0;
  Vector2 tempResult;
  Vector2 local_d4;
  Vector2 local_cc;
  Vector2 local_c4;
  Vector2 local_bc;
  Vector2 local_b4;
  float local_ac;
  undefined1 auStack_a8 [4];
  float determinant;
  Line line;
  size_t j;
  allocator<RVO::Line> local_79;
  __normal_iterator<const_RVO::Line_*,_std::vector<RVO::Line,_std::allocator<RVO::Line>_>_> local_78
  ;
  __normal_iterator<const_RVO::Line_*,_std::vector<RVO::Line,_std::allocator<RVO::Line>_>_> local_70
  ;
  __normal_iterator<const_RVO::Line_*,_std::vector<RVO::Line,_std::allocator<RVO::Line>_>_> local_68
  ;
  undefined1 local_60 [8];
  vector<RVO::Line,_std::allocator<RVO::Line>_> projLines;
  Vector2 local_40;
  size_t i;
  float distance;
  Vector2 *result_local;
  float radius_local;
  size_t beginLine_local;
  size_t numObstLines_local;
  vector<RVO::Line,_std::allocator<RVO::Line>_> *lines_local;
  
  i._4_4_ = 0.0;
  local_40 = (Vector2)beginLine;
  do {
    VVar1 = (Vector2)std::vector<RVO::Line,_std::allocator<RVO::Line>_>::size(lines);
    if ((ulong)VVar1 <= (ulong)local_40) {
      return;
    }
    pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                       (lines,(size_type)local_40);
    pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                       (lines,(size_type)local_40);
    projLines.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Vector2::operator-(&pvVar3->point,result);
    fVar6 = det(&pvVar2->direction,
                (Vector2 *)
                &projLines.super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    if (i._4_4_ < fVar6) {
      local_68._M_current = (Line *)std::vector<RVO::Line,_std::allocator<RVO::Line>_>::begin(lines)
      ;
      local_78._M_current = (Line *)std::vector<RVO::Line,_std::allocator<RVO::Line>_>::begin(lines)
      ;
      local_70 = __gnu_cxx::
                 __normal_iterator<const_RVO::Line_*,_std::vector<RVO::Line,_std::allocator<RVO::Line>_>_>
                 ::operator+(&local_78,numObstLines);
      std::allocator<RVO::Line>::allocator(&local_79);
      std::vector<RVO::Line,std::allocator<RVO::Line>>::
      vector<__gnu_cxx::__normal_iterator<RVO::Line_const*,std::vector<RVO::Line,std::allocator<RVO::Line>>>,void>
                ((vector<RVO::Line,std::allocator<RVO::Line>> *)local_60,local_68,local_70,&local_79
                );
      std::allocator<RVO::Line>::~allocator(&local_79);
      for (line.direction = (Vector2)numObstLines; (ulong)line.direction < (ulong)local_40;
          line.direction = (Vector2)((long)line.direction + 1)) {
        Line::Line((Line *)auStack_a8);
        pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                           (lines,(size_type)local_40);
        pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                           (lines,(size_type)line.direction);
        local_ac = det(&pvVar2->direction,&pvVar3->direction);
        dVar7 = std::fabs((double)(ulong)(uint)local_ac);
        if (1e-05 < SUB84(dVar7,0)) {
          pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)local_40);
          pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)line.direction);
          this = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                           (lines,(size_type)local_40);
          vector = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)line.direction);
          local_d4 = Vector2::operator-(&this->point,&vector->point);
          fVar6 = det(&pvVar3->direction,&local_d4);
          fVar6 = fVar6 / local_ac;
          pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)local_40);
          local_cc = operator*(fVar6,&pvVar3->direction);
          local_c4 = Vector2::operator+(&pvVar2->point,&local_cc);
          _auStack_a8 = local_c4;
LAB_00122bc7:
          pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)line.direction);
          pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)local_40);
          register0x00001200 = Vector2::operator-(&pvVar2->direction,&pvVar3->direction);
          line.point = normalize((Vector2 *)&tempResult.y_);
          std::vector<RVO::Line,_std::allocator<RVO::Line>_>::push_back
                    ((vector<RVO::Line,_std::allocator<RVO::Line>_> *)local_60,
                     (value_type *)auStack_a8);
        }
        else {
          pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)local_40);
          pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                             (lines,(size_type)line.direction);
          fVar6 = Vector2::operator*(&pvVar2->direction,&pvVar3->direction);
          if (fVar6 <= 0.0) {
            pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                               (lines,(size_type)local_40);
            pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                               (lines,(size_type)line.direction);
            local_bc = Vector2::operator+(&pvVar2->point,&pvVar3->point);
            local_b4 = operator*(0.5,&local_bc);
            _auStack_a8 = local_b4;
            goto LAB_00122bc7;
          }
        }
      }
      local_f0 = *result;
      pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                         (lines,(size_type)local_40);
      fVar6 = Vector2::y(&pvVar2->direction);
      pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                         (lines,(size_type)local_40);
      y = Vector2::x(&pvVar2->direction);
      Vector2::Vector2(&local_f8,-fVar6,y);
      sVar4 = linearProgram2((vector<RVO::Line,_std::allocator<RVO::Line>_> *)local_60,radius,
                             &local_f8,true,result);
      sVar5 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::size
                        ((vector<RVO::Line,_std::allocator<RVO::Line>_> *)local_60);
      if (sVar4 < sVar5) {
        *result = local_f0;
      }
      pvVar2 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                         (lines,(size_type)local_40);
      pvVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[]
                         (lines,(size_type)local_40);
      local_100 = Vector2::operator-(&pvVar3->point,result);
      i._4_4_ = det(&pvVar2->direction,&local_100);
      std::vector<RVO::Line,_std::allocator<RVO::Line>_>::~vector
                ((vector<RVO::Line,_std::allocator<RVO::Line>_> *)local_60);
    }
    local_40 = (Vector2)((long)local_40 + 1);
  } while( true );
}

Assistant:

void linearProgram3(const std::vector<Line> &lines, size_t numObstLines, size_t beginLine, float radius, Vector2 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginLine; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > distance) {
				/* Result does not satisfy constraint of line i. */
				std::vector<Line> projLines(lines.begin(), lines.begin() + static_cast<ptrdiff_t>(numObstLines));

				for (size_t j = numObstLines; j < i; ++j) {
					Line line;

					float determinant = det(lines[i].direction, lines[j].direction);

					if (std::fabs(determinant) <= RVO_EPSILON) {
						/* Line i and line j are parallel. */
						if (lines[i].direction * lines[j].direction > 0.0f) {
							/* Line i and line j point in the same direction. */
							continue;
						}
						else {
							/* Line i and line j point in opposite direction. */
							line.point = 0.5f * (lines[i].point + lines[j].point);
						}
					}
					else {
						line.point = lines[i].point + (det(lines[j].direction, lines[i].point - lines[j].point) / determinant) * lines[i].direction;
					}

					line.direction = normalize(lines[j].direction - lines[i].direction);
					projLines.push_back(line);
				}

				const Vector2 tempResult = result;

				if (linearProgram2(projLines, radius, Vector2(-lines[i].direction.y(), lines[i].direction.x()), true, result) < projLines.size()) {
					/* This should in principle not happen.  The result is by definition
					 * already in the feasible region of this linear program. If it fails,
					 * it is due to small floating point error, and the current result is
					 * kept.
					 */
					result = tempResult;
				}

				distance = det(lines[i].direction, lines[i].point - result);
			}
		}
	}